

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbp.cpp
# Opt level: O2

void __thiscall merlin::lbp::run(lbp *this)

{
  indexed_heap *this_00;
  pointer puVar1;
  long lVar2;
  pointer pfVar3;
  Type TVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ostream *poVar8;
  factor *pfVar21;
  undefined4 extraout_var;
  size_t e;
  index n;
  ulong uVar9;
  char *pcVar10;
  size_t j;
  long lVar11;
  ulong uVar12;
  size_t v;
  double extraout_XMM0_Qa;
  value vVar13;
  double dVar14;
  value vVar15;
  double dVar16;
  double __x;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  pair<double,_unsigned_long> pVar20;
  double local_148;
  long local_130;
  factor local_f0;
  factor logF;
  
  (*(this->super_algorithm)._vptr_algorithm[2])();
  lVar6 = ((long)(this->super_factor_graph).super_graphical_model.m_factors.
                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->super_factor_graph).super_graphical_model.m_factors.
                super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x60;
  auVar17._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar17._0_8_ = lVar6;
  auVar17._12_4_ = 0x45300000;
  dVar19 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) *
           (this->super_algorithm).m_stop_iter;
  uVar7 = (ulong)dVar19;
  local_148 = (this->super_algorithm).m_stop_obj + 1.0;
  dVar18 = (this->super_algorithm).m_stop_msg + 1.0;
  poVar8 = std::operator<<((ostream *)&std::cout,"[LBP] Begin message passing over factor graph ..."
                          );
  std::endl<char,std::char_traits<char>>(poVar8);
  this_00 = &this->m_priority;
  lVar6 = 1;
  local_130 = 0;
  uVar12 = 0;
  do {
    if (((dVar18 < (this->super_algorithm).m_stop_msg) ||
        (((long)(dVar19 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7) <= uVar12)) ||
       (local_148 < (this->super_algorithm).m_stop_obj)) {
      pcVar10 = "true: Consistent evidence";
LAB_001613d5:
      poVar8 = std::operator<<((ostream *)&std::cout,"[LBP] Converged after ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::operator<<(poVar8," iterations in ");
      dVar18 = timeSystem();
      poVar8 = std::ostream::_M_insert<double>(dVar18 - (this->super_algorithm).m_start_time);
      poVar8 = std::operator<<(poVar8," seconds");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"PR");
      std::endl<char,std::char_traits<char>>(poVar8);
      lVar6 = std::cout;
      *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(operator_delete__ + *(long *)(lVar6 + -0x18)) = 6;
      poVar8 = std::ostream::_M_insert<double>(this->m_logz);
      poVar8 = std::operator<<(poVar8," (");
      lVar6 = *(long *)poVar8;
      lVar11 = *(long *)(lVar6 + -0x18);
      *(uint *)(poVar8 + lVar11 + 0x18) = *(uint *)(poVar8 + lVar11 + 0x18) & 0xfffffefb | 0x100;
      *(undefined8 *)(poVar8 + *(long *)(lVar6 + -0x18) + 8) = 6;
      dVar18 = exp(this->m_logz);
      poVar8 = std::ostream::_M_insert<double>(dVar18);
      poVar8 = std::operator<<(poVar8,")");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"STATUS");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"MAR");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      for (uVar7 = 0;
          uVar7 < (ulong)((long)(this->super_factor_graph).m_vindex.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->super_factor_graph).m_vindex.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
        dVar18 = (this->super_factor_graph).super_graphical_model.m_dims.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar7];
        uVar12 = (ulong)dVar18;
        uVar12 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12;
        poVar8 = std::operator<<((ostream *)&std::cout," ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
          poVar8 = std::operator<<((ostream *)&std::cout," ");
          lVar6 = *(long *)poVar8;
          lVar11 = *(long *)(lVar6 + -0x18);
          *(uint *)(poVar8 + lVar11 + 0x18) = *(uint *)(poVar8 + lVar11 + 0x18) & 0xfffffefb | 4;
          *(undefined8 *)(poVar8 + *(long *)(lVar6 + -0x18) + 8) = 6;
          iVar5 = (*(this->super_algorithm)._vptr_algorithm[0xb])(this,uVar7,uVar12);
          std::ostream::_M_insert<double>
                    (*(double *)(*(long *)(CONCAT44(extraout_var,iVar5) + 0x40) + uVar9 * 8));
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      if (this->m_debug != false) {
        std::operator<<((ostream *)&std::cout,"Final log partition function is ");
        poVar8 = std::ostream::_M_insert<double>(this->m_logz);
        std::endl<char,std::char_traits<char>>(poVar8);
        std::operator<<((ostream *)&std::cout,"Final (normalized) beliefs\n");
        lVar6 = 0;
        for (uVar7 = 0;
            pfVar3 = (this->m_beliefs).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar7 < (ulong)(((long)(this->m_beliefs).
                                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar3) / 0x60
                           ); uVar7 = uVar7 + 1) {
          poVar8 = operator<<((ostream *)&std::cout,(factor *)((long)&pfVar3->_vptr_factor + lVar6))
          ;
          std::endl<char,std::char_traits<char>>(poVar8);
          lVar6 = lVar6 + 0x60;
        }
      }
      return;
    }
    TVar4 = (this->m_sched).t_;
    if (TVar4 == Priority) {
      pVar20 = indexed_heap::top(this_00);
      n = (this->super_factor_graph).super_graphical_model.super_graph.m_edges.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_start[pVar20.second].second;
      indexed_heap::pop(this_00);
      TVar4 = (this->m_sched).t_;
      dVar14 = extraout_XMM0_Qa;
    }
    else {
      puVar1 = (this->m_forder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      n = puVar1[local_130];
      local_130 = local_130 + 1;
      dVar14 = dVar18;
      if (local_130 ==
          (long)(this->m_forder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) {
        local_130 = 0;
      }
    }
    if (TVar4 != Flood) {
      log((merlin *)&logF,dVar14);
      pfVar21._0_4_ = (factor *)(*(this->super_algorithm)._vptr_algorithm[10])(this,n);
      factor::binaryOp<merlin::factor::binOpTimes>(&local_f0,pfVar21._0_4_,&logF);
      vVar13 = factor::sum(&local_f0);
      dVar14 = obj_entropy(this,n);
      factor::~factor(&local_f0);
      accept_incoming(this,n);
      pfVar21._0_4_ = (factor *)(*(this->super_algorithm)._vptr_algorithm[10])(this,n);
      factor::binaryOp<merlin::factor::binOpTimes>(&local_f0,pfVar21._0_4_,&logF);
      vVar15 = factor::sum(&local_f0);
      dVar16 = obj_entropy(this,n);
      local_148 = vVar15 + dVar16 + (0.0 - (vVar13 + dVar14));
      this->m_logz = this->m_logz + local_148;
      factor::~factor(&local_f0);
      factor::~factor(&logF);
    }
    update_outgoing(this,n);
    if ((this->m_sched).t_ == Priority) {
      pVar20 = indexed_heap::top(this_00);
      dVar18 = pVar20.first;
    }
    else if ((0.0 < (this->super_algorithm).m_stop_msg) && (local_130 == 0)) {
      lVar11 = 0;
      dVar18 = 0.0;
      for (uVar9 = 0;
          uVar9 < ((long)(this->super_factor_graph).super_graphical_model.super_graph.m_edges.
                         super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_factor_graph).super_graphical_model.super_graph.m_edges.
                         super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5 & 0xfffffffffffffffeU);
          uVar9 = uVar9 + 1) {
        dVar14 = factor::distance((factor *)
                                  ((long)&((this->m_msg_new).
                                           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor
                                  + lVar11),
                                  (factor *)
                                  ((long)&((this->m_msg).
                                           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor
                                  + lVar11),(Distance)(this->m_dist).t_);
        if (dVar14 <= dVar18) {
          dVar14 = dVar18;
        }
        lVar11 = lVar11 + 0x60;
        dVar18 = dVar14;
      }
    }
    dVar14 = this->m_logz;
    dVar16 = dVar14;
    if (((this->m_sched).t_ == Flood) && (local_130 == 0)) {
      this->m_logz = 0.0;
      for (uVar9 = 0;
          uVar9 < (ulong)(((long)(this->super_factor_graph).super_graphical_model.m_factors.
                                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->super_factor_graph).super_graphical_model.m_factors.
                                super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar9 = uVar9 + 1
          ) {
        accept_incoming(this,uVar9);
        pfVar21._0_4_ = (factor *)(*(this->super_algorithm)._vptr_algorithm[10])(this,uVar9);
        log((merlin *)&local_f0,__x);
        factor::binaryOp<merlin::factor::binOpTimes>(&logF,pfVar21._0_4_,&local_f0);
        vVar13 = factor::sum(&logF);
        dVar16 = obj_entropy(this,uVar9);
        this->m_logz = vVar13 + dVar16 + this->m_logz;
        factor::~factor(&logF);
        factor::~factor(&local_f0);
      }
      dVar16 = this->m_logz;
      local_148 = dVar14 - dVar16;
    }
    if (0x7fefffffffffffff < (ulong)ABS(dVar16)) {
      pcVar10 = "false: Inconsistent evidence or underflow";
      goto LAB_001613d5;
    }
    if ((ulong)((((long)(this->super_factor_graph).super_graphical_model.m_factors.
                        super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->super_factor_graph).super_graphical_model.m_factors.
                       super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x60) * lVar6) < uVar12) {
      lVar6 = lVar6 + 1;
      poVar8 = std::operator<<((ostream *)&std::cout,"  logZ: ");
      lVar11 = *(long *)poVar8;
      *(uint *)(poVar8 + *(long *)(lVar11 + -0x18) + 0x18) =
           *(uint *)(poVar8 + *(long *)(lVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 0x10) = 0xc;
      *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 6;
      poVar8 = std::ostream::_M_insert<double>(this->m_logz);
      poVar8 = std::operator<<(poVar8," (");
      lVar11 = *(long *)poVar8;
      lVar2 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar8 + lVar2 + 0x18) = *(uint *)(poVar8 + lVar2 + 0x18) & 0xfffffefb | 0x100;
      *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 6;
      dVar14 = exp(this->m_logz);
      poVar8 = std::ostream::_M_insert<double>(dVar14);
      std::operator<<(poVar8,") ");
      poVar8 = std::operator<<((ostream *)&std::cout,"\td=");
      lVar11 = *(long *)poVar8;
      lVar2 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar8 + lVar2 + 0x18) = *(uint *)(poVar8 + lVar2 + 0x18) & 0xfffffefb | 0x100;
      *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 6;
      poVar8 = std::ostream::_M_insert<double>(local_148);
      std::operator<<(poVar8,"\tm=");
      poVar8 = std::ostream::_M_insert<double>(dVar18);
      poVar8 = std::operator<<(poVar8,"\t time=");
      lVar11 = *(long *)poVar8;
      lVar2 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar8 + lVar2 + 0x18) = *(uint *)(poVar8 + lVar2 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 6;
      dVar14 = timeSystem();
      poVar8 = std::ostream::_M_insert<double>(dVar14 - (this->super_algorithm).m_start_time);
      poVar8 = std::operator<<(poVar8,"\ti=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void lbp::run() {

	init();

	// it's easier to count updates than "iterations"
	size_t stopIter = m_stop_iter * num_factors();

	bool ok = true;
	double dObj = m_stop_obj + 1.0, dMsg = m_stop_msg + 1.0;// initialize termination values
	size_t iter = 0, print = 1; // count updates and "iterations" for printing
	size_t f, n = 0;

	std::cout << "[LBP] Begin message passing over factor graph ..." << std::endl;
	for (; dMsg >= m_stop_msg && iter < stopIter && dObj >= m_stop_obj;) {

		if (m_sched == Schedule::Priority) { // priority schedule =>
			f = edge(m_priority.top().second).second; // get next factor for update from queue
			m_priority.pop();
		} else { // fixed schedule =>
			f = m_forder[n]; // get next factor from list
			if (++n == m_forder.size()) {
				n = 0; // loop over to the beginning of the fixed order
			}
		}

		if (m_sched != Schedule::Flood) {// For non-"flood" schedules,
			factor logF = log(get_factor(f));
			dObj = 0.0; // compute new belief and update objective:
			dObj -= (belief(f) * logF).sum() + obj_entropy(f); //   remove old contribution
			accept_incoming(f); //   accept all messages into factor f
			m_logz += dObj += (belief(f) * logF).sum() + obj_entropy(f); //   re-add new contribution
		}
		update_outgoing(f);		//   update outgoing messages from factor f

		if (m_sched == Schedule::Priority) {
			dMsg = m_priority.top().first; // priority schedule => easy to check msg stop
		} else if (m_stop_msg > 0 && n == 0) { // else check once each time through all factors
			dMsg = 0.0;
			for (size_t e = 0; e < 2 * num_edges(); ++e) {
				dMsg = std::max(dMsg, m_msg_new[e].distance(m_msg[e], m_dist));
			}
		}

		if (m_sched == Schedule::Flood && n == 0) { // for flooding schedules, recalculate all
			dObj = m_logz;
			m_logz = 0.0; //   the beliefs and objective now
			for (size_t f = 0; f < num_factors(); ++f) {
				accept_incoming(f);
				m_logz += (belief(f) * log(get_factor(f))).sum() + obj_entropy(f);
			}
			dObj -= m_logz;
		}

		// check if NaN or -inf
		if (isnan(m_logz) || isinf(m_logz)) {
			ok = false;
			break;
		}

		if (iter > print * num_factors()) {
			print++;
			std::cout << "  logZ: " << std::fixed << std::setw(12)
				<< std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ") ";
			std::cout << "\td=" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< dObj << "\tm=" << dMsg << "\t time="  << std::fixed
				<< std::setprecision(MERLIN_PRECISION)
				<< (timeSystem() - m_start_time)
				<< "\ti=" << iter << std::endl;
		}

		iter++;
	}

	// Output solution (UAI output format)
	std::cout << "[LBP] Converged after " << iter << " iterations in "
		<< (timeSystem() - m_start_time) << " seconds" << std::endl;
	std::cout << "PR" << std::endl;
	std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz) << ")" << std::endl;
	if (!ok) {
		std::cout << "STATUS" << std::endl;
		std::cout << "false: Inconsistent evidence or underflow" << std::endl;
	} else {
		std::cout << "STATUS" << std::endl;
		std::cout << "true: Consistent evidence" << std::endl;
	}
	std::cout << "MAR" << std::endl;
	std::cout << nvar();
	for (size_t v = 0; v < m_vindex.size(); ++v) {
		variable VX = var(v);
		std::cout << " " << VX.states();
		for (size_t j = 0; j < VX.states(); ++j) {
			std::cout << " " << std::fixed
				<< std::setprecision(MERLIN_PRECISION) << belief(VX)[j];
		}
	}
	std::cout << std::endl;

	if (m_debug) {
		std::cout << "Final log partition function is " << m_logz << std::endl;
		std::cout << "Final (normalized) beliefs\n";
		for (size_t i = 0; i < m_beliefs.size(); ++i) {
			std::cout << m_beliefs[i] << std::endl;
		}
	}
}